

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O0

void __thiscall
VmFunction::VmFunction
          (VmFunction *this,Allocator *allocator,VmType type,SynBase *source,FunctionData *function,
          ScopeData *scope,VmType returnType)

{
  FunctionData *function_local;
  SynBase *source_local;
  Allocator *allocator_local;
  VmFunction *this_local;
  VmType type_local;
  
  VmValue::VmValue(&this->super_VmValue,4,allocator,type,source);
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmFunction_0052dd78;
  this->function = function;
  this->scope = scope;
  (this->returnType).type = returnType.type;
  (this->returnType).size = returnType.size;
  (this->returnType).structType = returnType.structType;
  SmallArray<VariableData_*,_4U>::SmallArray(&this->allocas,allocator);
  SmallArray<VmBlock_*,_4U>::SmallArray(&this->restoreBlocks,allocator);
  this->firstBlock = (VmBlock *)0x0;
  this->lastBlock = (VmBlock *)0x0;
  this->nextBlockId = 1;
  this->nextInstructionId = 1;
  this->next = (VmFunction *)0x0;
  this->listed = false;
  this->checkedInline = false;
  this->canInline = false;
  this->vmAddress = 0xffffffff;
  this->vmCodeSize = 0;
  this->regVmAddress = 0xffffffff;
  this->regVmCodeSize = 0;
  this->regVmRegisters = 0;
  this->nextRestoreBlock = 0;
  this->nextColor = 0;
  this->nextSearchMarker = 1;
  return;
}

Assistant:

VmFunction(Allocator *allocator, VmType type, SynBase *source, FunctionData *function, ScopeData *scope, VmType returnType): VmValue(myTypeID, allocator, type, source), function(function), scope(scope), returnType(returnType), allocas(allocator), restoreBlocks(allocator)
	{
		firstBlock = NULL;
		lastBlock = NULL;

		nextBlockId = 1;
		nextInstructionId = 1;

		next = NULL;
		listed = false;

		checkedInline = false;
		canInline = false;

		vmAddress = ~0u;
		vmCodeSize = 0;

		regVmAddress = ~0u;
		regVmCodeSize = 0;
		regVmRegisters = 0;

		nextRestoreBlock = 0;

		nextColor = 0;
		nextSearchMarker = 1;
	}